

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void looplist(ident *id,char *list,uint *body,bool search)

{
  tagval *ptVar1;
  bool bVar2;
  anon_union_8_5_08252708_for_identval_0 aVar3;
  int iVar4;
  char *end;
  char *start;
  tagval t;
  char *s;
  identstack stack;
  
  ptVar1 = commandret;
  if (id->type == 4) {
    iVar4 = 1;
    s = list;
    do {
      bVar2 = parselist(&s,&start,&end,&listquotestart,&listquoteend);
      ptVar1 = commandret;
      if (!bVar2) {
        if (search) {
          (commandret->super_identval).field_0.i = -1;
          ptVar1->type = 1;
        }
        if (iVar4 == 1) {
          return;
        }
        goto LAB_0012e680;
      }
      aVar3.s = newstring(start,(long)end - (long)start);
      if (iVar4 == 1) {
        t.type = 3;
        t.super_identval.field_0 =
             (anon_union_8_5_08252708_for_identval_0)(anon_union_8_5_08252708_for_identval_0)aVar3.s
        ;
        pusharg(id,&t,&stack);
        *(byte *)&id->flags = (byte)id->flags & 0xdf;
      }
      else {
        if ((id->field_2).minval == 3) {
          if ((id->field_4).args != (char *)0x0) {
            operator_delete__((id->field_4).args);
          }
        }
        else {
          (id->field_2).minval = 3;
        }
        cleancode(id);
        (id->field_4).val.field_0.s = (char *)aVar3;
      }
      bVar2 = executebool(body);
      ptVar1 = commandret;
      iVar4 = iVar4 + -1;
    } while (!bVar2 || !search);
    commandret->type = 1;
    (ptVar1->super_identval).field_0.i = -iVar4;
LAB_0012e680:
    poparg(id);
  }
  else if (search) {
    commandret->type = 1;
    (ptVar1->super_identval).field_0.i = -1;
  }
  return;
}

Assistant:

void looplist(ident *id, const char *list, const uint *body, bool search)
{
    if(id->type!=ID_ALIAS) { if(search) intret(-1); return; }
    identstack stack;
    int n = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        char *val = newstring(start, end-start);
        if(n++)
        {
            if(id->valtype == VAL_STR) delete[] id->val.s;
            else id->valtype = VAL_STR;
            cleancode(*id);
            id->val.s = val;
        }
        else
        {
            tagval t;
            t.setstr(val);
            pusharg(*id, t, stack);
            id->flags &= ~IDF_UNKNOWN;
        }
        if(executebool(body) && search) { intret(n-1); search = false; break; }
    }
    if(search) intret(-1);
    if(n) poparg(*id);
}